

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiledata_unittest.cc
# Opt level: O3

ssize_t anon_unknown.dwarf_3377::ReadPersistent(int fd,void *buf,size_t count)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  ssize_t extraout_RAX;
  undefined4 extraout_var;
  ulong uVar5;
  ssize_t sVar4;
  
  if (fd < 0) {
    _GLOBAL__N_1::ReadPersistent();
    sVar4 = extraout_RAX;
    if (-1 < fd) {
      iVar1 = close(fd);
      sVar4 = CONCAT44(extraout_var,iVar1);
    }
    return sVar4;
  }
  uVar5 = 0;
  do {
    if (count < uVar5 || count - uVar5 == 0) break;
    while (sVar2 = read(fd,(void *)((long)buf + uVar5),count - uVar5), sVar2 < 0) {
      piVar3 = __errno_location();
      if (*piVar3 != 4) {
        return -1;
      }
    }
    uVar5 = uVar5 + sVar2;
  } while (sVar2 != 0);
  if (uVar5 <= count) {
    return uVar5;
  }
  syscall(1,2,"Check failed: num_bytes <= count\n",0x21);
  abort();
}

Assistant:

static ssize_t ReadPersistent(const int fd, void *buf, const size_t count) {
  CHECK_GE(fd, 0);
  char *buf0 = reinterpret_cast<char *>(buf);
  ssize_t num_bytes = 0;
  while (num_bytes < count) {
    ssize_t len;
    NO_INTR(len = read(fd, buf0 + num_bytes, count - num_bytes));
    if (len < 0) {  // There was an error other than EINTR.
      return -1;
    }
    if (len == 0) {  // Reached EOF.
      break;
    }
    num_bytes += len;
  }
  CHECK(num_bytes <= count);
  return num_bytes;
}